

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O1

ostream * operator<<(ostream *ostream,SSLSocket *SSLSocket)

{
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*(SSLSocket->super_Socket).super_stream._vptr_stream[1])(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return ostream;
}

Assistant:

std::ostream &operator<<(std::ostream &ostream, blc::network::SSLSocket &SSLSocket) {
	ostream << SSLSocket.read();
	return (ostream);
}